

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absVta.c
# Opt level: O3

void Vta_ManProfileAddition(Vta_Man_t *p,Vec_Int_t *vTermsToAdd)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  void *pvVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  Vta_Obj_t *__nmemb;
  
  iVar2 = p->pPars->iFrame;
  __nmemb = (Vta_Obj_t *)((long)iVar2 + 1);
  pvVar5 = calloc((size_t)__nmemb,4);
  iVar8 = vTermsToAdd->nSize;
  if (0 < (long)iVar8) {
    piVar4 = vTermsToAdd->pArray;
    lVar6 = 0;
    do {
      iVar3 = piVar4[lVar6];
      lVar7 = (long)iVar3;
      if ((lVar7 < 0) || (p->nObjs <= iVar3)) {
        __assert_fail("i >= 0 && i < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                      ,0x68,"Vta_Obj_t *Vta_ManObj(Vta_Man_t *, int)");
      }
      if (iVar3 == 0) break;
      __nmemb = p->pObjs;
      if ((__nmemb[lVar7].iObj < 0) || (p->pGia->nObjs <= __nmemb[lVar7].iObj)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pGia->pObjs == (Gia_Obj_t *)0x0) break;
      __nmemb = __nmemb + lVar7;
      piVar1 = (int *)((long)pvVar5 + (long)__nmemb->iFrame * 4);
      *piVar1 = *piVar1 + 1;
      lVar6 = lVar6 + 1;
    } while (iVar8 != lVar6);
  }
  iVar8 = (int)__nmemb;
  if (-1 < iVar2) {
    lVar6 = -1;
    do {
      Abc_Print((int)__nmemb,"%2d",(ulong)*(uint *)((long)pvVar5 + lVar6 * 4 + 4));
      iVar8 = (int)__nmemb;
      lVar6 = lVar6 + 1;
    } while (lVar6 < p->pPars->iFrame);
  }
  Abc_Print(iVar8,"***\n");
  return;
}

Assistant:

void Vta_ManProfileAddition( Vta_Man_t * p, Vec_Int_t * vTermsToAdd )
{
    Vta_Obj_t * pThis;
    Gia_Obj_t * pObj;
    // profile the added ones
    int i, * pCounters = ABC_CALLOC( int, p->pPars->iFrame+1 );
    Vta_ManForEachObjObjVec( vTermsToAdd, p, pThis, pObj, i )
        pCounters[pThis->iFrame]++;
    for ( i = 0; i <= p->pPars->iFrame; i++ )
        Abc_Print( 1, "%2d", pCounters[i] );
    Abc_Print( 1, "***\n" );
}